

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall
AddrManImpl::Serialize<HashedSourceWriter<AutoFile>>
          (AddrManImpl *this,HashedSourceWriter<AutoFile> *s_)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  long in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  int bucket;
  AddrInfo *info_1;
  value_type *entry_1;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *__range1_1;
  AddrInfo *info;
  value_type *entry;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *__range1;
  int nIds;
  int nIndex;
  int nSize;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  mapUnkIds;
  int nUBuckets;
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> s;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  SerParams *in_stack_fffffffffffffec8;
  AddrInfo *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  NetGroupManager *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  int iVar4;
  undefined4 in_stack_fffffffffffffefc;
  int iVar5;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff00;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff08;
  int local_d0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffec8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>::ParamsStream
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (HashedSourceWriter<AutoFile> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (uchar *)in_stack_fffffffffffffed0);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (uchar *)in_stack_fffffffffffffed0);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (uint256 *)in_stack_fffffffffffffed0);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (int *)in_stack_fffffffffffffed0);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (int *)in_stack_fffffffffffffed0);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (int *)in_stack_fffffffffffffed0);
  std::
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  ::unordered_map((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                   *)in_stack_fffffffffffffec8);
  local_d0 = 0;
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::begin((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)in_stack_fffffffffffffed0);
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
         *)in_stack_fffffffffffffed0);
  while (bVar2 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                            in_stack_fffffffffffffed0), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
             operator*((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                       in_stack_fffffffffffffec8);
    in_stack_fffffffffffffedc = local_d0;
    in_stack_fffffffffffffee0 =
         (NetGroupManager *)
         std::
         unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
         ::operator[]((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                       *)CONCAT44(local_d0,in_stack_fffffffffffffed8),
                      (key_type *)in_stack_fffffffffffffed0);
    *(int *)&(in_stack_fffffffffffffee0->m_asmap).super__Bvector_base<std::allocator<bool>_>._M_impl
             .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         in_stack_fffffffffffffedc;
    if ((pvVar3->second).nRefCount != 0) {
      if (local_d0 == *(int *)(in_RDI + 0x20178)) {
        __assert_fail("nIds != nNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ,0xc5,
                      "void AddrManImpl::Serialize(Stream &) const [Stream = HashedSourceWriter<AutoFile>]"
                     );
      }
      ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
                ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
      local_d0 = local_d0 + 1;
    }
    std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::operator++
              ((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
               in_stack_fffffffffffffec8);
  }
  local_d0 = 0;
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::begin((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)in_stack_fffffffffffffed0);
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::end((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
         *)in_stack_fffffffffffffed0);
  while (bVar2 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                            in_stack_fffffffffffffed0), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
             operator*((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                       in_stack_fffffffffffffec8);
    if (((pvVar3->second).fInTried & 1U) != 0) {
      if (local_d0 == *(int *)(in_RDI + 0x170)) {
        __assert_fail("nIds != nTried",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ,0xce,
                      "void AddrManImpl::Serialize(Stream &) const [Stream = HashedSourceWriter<AutoFile>]"
                     );
      }
      ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
                ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
      local_d0 = local_d0 + 1;
    }
    std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::operator++
              ((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
               in_stack_fffffffffffffec8);
  }
  for (iVar5 = 0; iVar5 < 0x400; iVar5 = iVar5 + 1) {
    for (iVar4 = 0; iVar4 < 0x40; iVar4 = iVar4 + 1) {
    }
    ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
              ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (int *)in_stack_fffffffffffffed0);
    for (iVar4 = 0; iVar4 < 0x40; iVar4 = iVar4 + 1) {
      if (*(long *)(in_RDI + 0x20180 + (long)iVar5 * 0x200 + (long)iVar4 * 8) != -1) {
        in_stack_fffffffffffffed0 =
             (AddrInfo *)
             std::
             unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
             ::operator[]((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (key_type *)in_stack_fffffffffffffed0);
        ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
                  ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (int *)in_stack_fffffffffffffed0);
      }
    }
  }
  NetGroupManager::GetAsmapChecksum(in_stack_fffffffffffffee0);
  ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
            ((ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (uint256 *)in_stack_fffffffffffffed0);
  std::
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  ::~unordered_map((unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
                    *)in_stack_fffffffffffffec8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Serialize(Stream& s_) const
{
    LOCK(cs);

    /**
     * Serialized format.
     * * format version byte (@see `Format`)
     * * lowest compatible format version byte. This is used to help old software decide
     *   whether to parse the file. For example:
     *   * Bitcoin Core version N knows how to parse up to format=3. If a new format=4 is
     *     introduced in version N+1 that is compatible with format=3 and it is known that
     *     version N will be able to parse it, then version N+1 will write
     *     (format=4, lowest_compatible=3) in the first two bytes of the file, and so
     *     version N will still try to parse it.
     *   * Bitcoin Core version N+2 introduces a new incompatible format=5. It will write
     *     (format=5, lowest_compatible=5) and so any versions that do not know how to parse
     *     format=5 will not try to read the file.
     * * nKey
     * * nNew
     * * nTried
     * * number of "new" buckets XOR 2**30
     * * all new addresses (total count: nNew)
     * * all tried addresses (total count: nTried)
     * * for each new bucket:
     *   * number of elements
     *   * for each element: index in the serialized "all new addresses"
     * * asmap checksum
     *
     * 2**30 is xorred with the number of buckets to make addrman deserializer v0 detect it
     * as incompatible. This is necessary because it did not check the version number on
     * deserialization.
     *
     * vvNew, vvTried, mapInfo, mapAddr and vRandom are never encoded explicitly;
     * they are instead reconstructed from the other information.
     *
     * This format is more complex, but significantly smaller (at most 1.5 MiB), and supports
     * changes to the ADDRMAN_ parameters without breaking the on-disk structure.
     *
     * We don't use SERIALIZE_METHODS since the serialization and deserialization code has
     * very little in common.
     */

    // Always serialize in the latest version (FILE_FORMAT).
    ParamsStream s{s_, CAddress::V2_DISK};

    s << static_cast<uint8_t>(FILE_FORMAT);

    // Increment `lowest_compatible` iff a newly introduced format is incompatible with
    // the previous one.
    static constexpr uint8_t lowest_compatible = Format::V4_MULTIPORT;
    s << static_cast<uint8_t>(INCOMPATIBILITY_BASE + lowest_compatible);

    s << nKey;
    s << nNew;
    s << nTried;

    int nUBuckets = ADDRMAN_NEW_BUCKET_COUNT ^ (1 << 30);
    s << nUBuckets;
    std::unordered_map<nid_type, int> mapUnkIds;
    int nIds = 0;
    for (const auto& entry : mapInfo) {
        mapUnkIds[entry.first] = nIds;
        const AddrInfo& info = entry.second;
        if (info.nRefCount) {
            assert(nIds != nNew); // this means nNew was wrong, oh ow
            s << info;
            nIds++;
        }
    }
    nIds = 0;
    for (const auto& entry : mapInfo) {
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            assert(nIds != nTried); // this means nTried was wrong, oh ow
            s << info;
            nIds++;
        }
    }
    for (int bucket = 0; bucket < ADDRMAN_NEW_BUCKET_COUNT; bucket++) {
        int nSize = 0;
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[bucket][i] != -1)
                nSize++;
        }
        s << nSize;
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[bucket][i] != -1) {
                int nIndex = mapUnkIds[vvNew[bucket][i]];
                s << nIndex;
            }
        }
    }
    // Store asmap checksum after bucket entries so that it
    // can be ignored by older clients for backward compatibility.
    s << m_netgroupman.GetAsmapChecksum();
}